

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

int ecdh_make_public_internal
              (mbedtls_ecdh_context_mbed *ctx,size_t *olen,int point_format,uchar *buf,size_t blen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,int restart_enabled)

{
  int ret;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t blen_local;
  uchar *buf_local;
  int point_format_local;
  size_t *olen_local;
  mbedtls_ecdh_context_mbed *ctx_local;
  
  if ((ctx->grp).pbits == 0) {
    ctx_local._4_4_ = -0x4f80;
  }
  else {
    ctx_local._4_4_ = mbedtls_ecdh_gen_public(&ctx->grp,&ctx->d,&ctx->Q,f_rng,p_rng);
    if (ctx_local._4_4_ == 0) {
      ctx_local._4_4_ = mbedtls_ecp_tls_write_point(&ctx->grp,&ctx->Q,point_format,olen,buf,blen);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int ecdh_make_public_internal(mbedtls_ecdh_context_mbed *ctx,
                                     size_t *olen, int point_format,
                                     unsigned char *buf, size_t blen,
                                     int (*f_rng)(void *,
                                                  unsigned char *,
                                                  size_t),
                                     void *p_rng,
                                     int restart_enabled)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
#if defined(MBEDTLS_ECP_RESTARTABLE)
    mbedtls_ecp_restart_ctx *rs_ctx = NULL;
#endif

    if (ctx->grp.pbits == 0) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if (restart_enabled) {
        rs_ctx = &ctx->rs;
    }
#else
    (void) restart_enabled;
#endif

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if ((ret = ecdh_gen_public_restartable(&ctx->grp, &ctx->d, &ctx->Q,
                                           f_rng, p_rng, rs_ctx)) != 0) {
        return ret;
    }
#else
    if ((ret = mbedtls_ecdh_gen_public(&ctx->grp, &ctx->d, &ctx->Q,
                                       f_rng, p_rng)) != 0) {
        return ret;
    }
#endif /* MBEDTLS_ECP_RESTARTABLE */

    return mbedtls_ecp_tls_write_point(&ctx->grp, &ctx->Q, point_format, olen,
                                       buf, blen);
}